

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Operator(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
           *this,size_t t_precedence)

{
  bool bVar1;
  size_type t_match_start;
  const_reference pvVar2;
  eval_error *peVar3;
  element_type *peVar4;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  undefined1 local_189;
  File_Position local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  allocator<char> local_139;
  string local_138;
  undefined1 local_111;
  File_Position local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  Static_String local_c8;
  undefined1 local_b1;
  File_Position local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [8];
  string oper;
  size_type prev_stack_top;
  bool retval;
  Depth_Counter dc;
  size_t t_precedence_local;
  ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  dc.parser = (ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
               *)t_precedence;
  Depth_Counter::Depth_Counter((Depth_Counter *)&stack0xffffffffffffffd8,this);
  prev_stack_top._7_1_ = false;
  t_match_start =
       Catch::clara::std::
       vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>_>_>
       ::size(&this->m_match_stack);
  pvVar2 = Catch::clara::std::array<chaiscript::Operator_Precedence,_12UL>::operator[]
                     (&m_operators,(size_type)dc.parser);
  if (*pvVar2 == Prefix) {
    this_local._7_1_ = Value(this);
  }
  else {
    bVar1 = Operator(this,(size_t)((long)&((dc.parser)->super_ChaiScript_Parser_Base).
                                          _vptr_ChaiScript_Parser_Base + 1));
    if (bVar1) {
      prev_stack_top._7_1_ = true;
      std::__cxx11::string::string((string *)local_68);
      while (bVar1 = Operator_Helper(this,(size_t)dc.parser,(string *)local_68), bVar1) {
        do {
          bVar1 = Eol(this);
        } while (bVar1);
        bVar1 = Operator(this,(size_t)((long)&((dc.parser)->super_ChaiScript_Parser_Base).
                                              _vptr_ChaiScript_Parser_Base + 1));
        if (!bVar1) {
          local_b1 = 1;
          peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
          std::operator+(&local_a8,"Incomplete \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68);
          std::operator+(&local_88,&local_a8,"\' expression");
          File_Position::File_Position(&local_b0,(this->m_position).line,(this->m_position).col);
          peVar4 = Catch::clara::std::
                   __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)&this->m_filename);
          exception::eval_error::eval_error(peVar3,&local_88,&local_b0,peVar4);
          local_b1 = 0;
          __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
        }
        pvVar2 = Catch::clara::std::array<chaiscript::Operator_Precedence,_12UL>::operator[]
                           (&m_operators,(size_type)dc.parser);
        switch(*pvVar2) {
        case Ternary_Cond:
          utility::Static_String::Static_String<2ul>(&local_c8,(char (*) [2])0xb722ef);
          bVar1 = Symbol(this,&local_c8,false);
          if (!bVar1) {
            local_189 = 1;
            peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
            std::operator+(&local_180,"Incomplete \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68);
            std::operator+(&local_160,&local_180,"\' expression");
            File_Position::File_Position(&local_188,(this->m_position).line,(this->m_position).col);
            peVar4 = Catch::clara::std::
                     __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->m_filename);
            exception::eval_error::eval_error(peVar3,&local_160,&local_188,peVar4);
            local_189 = 0;
            __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          bVar1 = Operator(this,(size_t)((long)&((dc.parser)->super_ChaiScript_Parser_Base).
                                                _vptr_ChaiScript_Parser_Base + 1));
          if (!bVar1) {
            local_111 = 1;
            peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
            std::operator+(&local_108,"Incomplete \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_68);
            std::operator+(&local_e8,&local_108,"\' expression");
            File_Position::File_Position(&local_110,(this->m_position).line,(this->m_position).col);
            peVar4 = Catch::clara::std::
                     __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)&this->m_filename);
            exception::eval_error::eval_error(peVar3,&local_e8,&local_110,peVar4);
            local_111 = 0;
            __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"",&local_139);
          ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
          ::
          build_match<chaiscript::eval::If_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
                    ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                      *)this,t_match_start,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::allocator<char>::~allocator((allocator<char> *)&local_139);
          break;
        case Logical_Or:
          std::__cxx11::string::string
                    ((string *)&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
          ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
          ::
          build_match<chaiscript::eval::Logical_Or_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
                    ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                      *)this,t_match_start,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          break;
        case Logical_And:
          std::__cxx11::string::string
                    ((string *)&local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
          ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
          ::
          build_match<chaiscript::eval::Logical_And_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
                    ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                      *)this,t_match_start,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          break;
        case Bitwise_Or:
        case Bitwise_Xor:
        case Bitwise_And:
        case Equality:
        case Comparison:
        case Shift:
        case Addition:
        case Multiplication:
          std::__cxx11::string::string
                    ((string *)&local_1b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
          ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
          ::
          build_match<chaiscript::eval::Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>>
                    ((ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                      *)this,t_match_start,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          break;
        case Prefix:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/ChaiScript[P]ChaiScript/include/chaiscript/language/chaiscript_parser.hpp"
                        ,0x9cf,
                        "bool chaiscript::parser::ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>, chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold, chaiscript::optimizer::Unused_Return, chaiscript::optimizer::Constant_Fold, chaiscript::optimizer::If, chaiscript::optimizer::Return, chaiscript::optimizer::Dead_Code, chaiscript::optimizer::Block, chaiscript::optimizer::For_Loop, chaiscript::optimizer::Assign_Decl>>::Operator(const size_t) [Tracer = chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>, Optimizer = chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold, chaiscript::optimizer::Unused_Return, chaiscript::optimizer::Constant_Fold, chaiscript::optimizer::If, chaiscript::optimizer::Return, chaiscript::optimizer::Dead_Code, chaiscript::optimizer::Block, chaiscript::optimizer::For_Loop, chaiscript::optimizer::Assign_Decl>, Parse_Depth = 512]"
                       );
        }
      }
      std::__cxx11::string::~string((string *)local_68);
    }
    this_local._7_1_ = prev_stack_top._7_1_;
  }
  Depth_Counter::~Depth_Counter((Depth_Counter *)&stack0xffffffffffffffd8);
  return this_local._7_1_;
}

Assistant:

bool Operator(const size_t t_precedence = 0) {
        Depth_Counter dc{this};
        bool retval = false;
        const auto prev_stack_top = m_match_stack.size();

        if (m_operators[t_precedence] != Operator_Precedence::Prefix) {
          if (Operator(t_precedence + 1)) {
            retval = true;
            std::string oper;
            while (Operator_Helper(t_precedence, oper)) {
              while (Eol()) {
              }
              if (!Operator(t_precedence + 1)) {
                throw exception::eval_error("Incomplete '" + oper + "' expression",
                                            File_Position(m_position.line, m_position.col),
                                            *m_filename);
              }

              switch (m_operators[t_precedence]) {
                case (Operator_Precedence::Ternary_Cond):
                  if (Symbol(":")) {
                    if (!Operator(t_precedence + 1)) {
                      throw exception::eval_error("Incomplete '" + oper + "' expression",
                                                  File_Position(m_position.line, m_position.col),
                                                  *m_filename);
                    }
                    build_match<eval::If_AST_Node<Tracer>>(prev_stack_top);
                  } else {
                    throw exception::eval_error("Incomplete '" + oper + "' expression",
                                                File_Position(m_position.line, m_position.col),
                                                *m_filename);
                  }
                  break;

                case (Operator_Precedence::Addition):
                case (Operator_Precedence::Multiplication):
                case (Operator_Precedence::Shift):
                case (Operator_Precedence::Equality):
                case (Operator_Precedence::Bitwise_And):
                case (Operator_Precedence::Bitwise_Xor):
                case (Operator_Precedence::Bitwise_Or):
                case (Operator_Precedence::Comparison):
                  build_match<eval::Binary_Operator_AST_Node<Tracer>>(prev_stack_top, oper);
                  break;

                case (Operator_Precedence::Logical_And):
                  build_match<eval::Logical_And_AST_Node<Tracer>>(prev_stack_top, oper);
                  break;
                case (Operator_Precedence::Logical_Or):
                  build_match<eval::Logical_Or_AST_Node<Tracer>>(prev_stack_top, oper);
                  break;
                case (Operator_Precedence::Prefix):
                  assert(false); // cannot reach here because of if() statement at the top
                  break;

                  //                default:
                  //                  throw exception::eval_error("Internal error: unhandled ast_node",
                  //                  File_Position(m_position.line, m_position.col), *m_filename);
              }
            }
          }
        } else {
          return Value();
        }

        return retval;
      }